

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::InteractionStorageBuffers1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionStorageBuffers1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long *plVar1;
  TestError *pTVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long *local_a0;
  long local_90;
  long lStack_88;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (supported_variable_types_map._16_8_ != 0) {
    lVar5 = 0x21f1cb8;
    lVar3 = supported_variable_types_map._16_8_;
    do {
      if ((int)TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES <
          *(int *)(lVar3 + 0x20)) {
        lVar5 = lVar3;
      }
      lVar3 = *(long *)(lVar3 + 0x10 +
                       (ulong)(*(int *)(lVar3 + 0x20) <
                              (int)TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT) * 8);
    } while (lVar3 != 0);
    if ((lVar5 != 0x21f1cb8) &&
       (*(int *)(lVar5 + 0x20) < (int)TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE))
    {
      shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
      shader_source._M_string_length = 0;
      shader_source.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::append((char *)&shader_source);
      std::operator+(&local_50,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar5 + 0x28));
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar4 = plVar1 + 2;
      if ((long *)*plVar1 == plVar4) {
        local_90 = *plVar4;
        lStack_88 = plVar1[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar4;
        local_a0 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar4;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_a0);
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&shader_source);
      std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
      if (tested_shader_type < SHADER_TYPE_LAST) {
        (*(code *)(&DAT_01ad4294 + *(int *)(&DAT_01ad4294 + (ulong)tested_shader_type * 4)))();
        return;
      }
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1cab);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar2,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1cb2);
  __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionStorageBuffers1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source;

			shader_source += "buffer uBlocka {\n";
			shader_source += "    " + var_iterator->second.type + " x[1][1][1][1][1][1];\n";
			shader_source += "};\n\n";
			shader_source += shader_start;

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}